

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Decode
          (UnderwaterAcousticEmitterSystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  undefined1 local_80 [8];
  UnderwaterAcousticEmitterBeam UAEB;
  KUINT8 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  UnderwaterAcousticEmitterSystem *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x14) {
    UAEB.m_UAFPD.m_f32DEBeamwidth._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    UAEB.m_UAFPD.m_f32DEBeamwidth._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui8EmitterSystemDataLength);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8NumBeams);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  pKVar2 = operator>>(pKVar2,&(this->m_AES).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_Location).super_DataTypeBase);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::clear(&this->m_vUAEB);
  for (UAEB.m_UAFPD.m_f32DEBeamwidth._2_1_ = 0;
      UAEB.m_UAFPD.m_f32DEBeamwidth._2_1_ < this->m_ui8NumBeams;
      UAEB.m_UAFPD.m_f32DEBeamwidth._2_1_ = UAEB.m_UAFPD.m_f32DEBeamwidth._2_1_ + 1) {
    UnderwaterAcousticEmitterBeam::UnderwaterAcousticEmitterBeam
              ((UnderwaterAcousticEmitterBeam *)local_80);
    operator>>(local_18,(DataTypeBase *)local_80);
    std::
    vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
    ::push_back(&this->m_vUAEB,(value_type *)local_80);
    UnderwaterAcousticEmitterBeam::~UnderwaterAcousticEmitterBeam
              ((UnderwaterAcousticEmitterBeam *)local_80);
  }
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EmitterSystemDataLength
           >> m_ui8NumBeams
           >> m_ui16Padding1
           >> KDIS_STREAM m_AES
           >> KDIS_STREAM m_Location;

    m_vUAEB.clear();

    for( KUINT8 i = 0; i < m_ui8NumBeams; ++i )
    {
        UnderwaterAcousticEmitterBeam UAEB;
        stream >> KDIS_STREAM UAEB;
        m_vUAEB.push_back( UAEB );
    }
}